

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_frame_core
          (dwarf_resolver *this,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  Dwarf_Addr pc;
  Dwarf_Half DVar1;
  die_object *cu_die;
  source_location location;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name;
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> cu;
  char *in_stack_ffffffffffffff68;
  anon_union_32_2_d41c7fdf_for_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>_2
  local_90;
  bool local_70;
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> local_68;
  
  pc = object_frame_info->object_address;
  lookup_cu(&local_68,this,pc);
  if (local_68.holds_value == true) {
    cu_die = maybe_owned_die_object::get((maybe_owned_die_object *)&local_68);
    get_dwo_name_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                *)&local_90,this,cu_die);
    DVar1 = die_object::get_tag(cu_die);
    if ((DVar1 == 0x4a) || ((local_70 == true && ((this->skeleton).holds_value == false)))) {
      perform_dwarf_fission_resolution
                (this,cu_die,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  *)&local_90,object_frame_info,frame,inlines);
    }
    else {
      retrieve_line_info(this,cu_die,pc,frame);
      if (local_68.holds_value == false) {
        location._8_8_ = "Optional does not contain a value";
        location.file = (char *)0x12b;
        assert_fail((detail *)0x0,0x196408,
                    "T &cpptrace::detail::optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info>::unwrap() & [T = cpptrace::detail::libdwarf::dwarf_resolver::cu_info]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/utils/utils.hpp"
                    ,location,in_stack_ffffffffffffff68);
      }
      retrieve_symbol(this,cu_die,pc,local_68.field_0.uvalue.dwversion,frame,inlines);
    }
    if ((local_70 == true) &&
       (local_90.uvalue._M_dataplus._M_p != (_Alloc_hider)((long)&local_90.uvalue + 0x10))) {
      operator_delete((void *)local_90.uvalue._M_dataplus._M_p,local_90._16_8_ + 1);
    }
  }
  if ((local_68.holds_value == true) &&
     (local_68.field_0.uvalue.cu_die.ref_die.holds_value = false,
     local_68.field_0.uvalue.cu_die.owned_die.holds_value == true)) {
    die_object::~die_object((die_object *)&local_68);
  }
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void resolve_frame_core(
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            auto pc = object_frame_info.object_address;
            if(dump_dwarf) {
                std::fprintf(stderr, "%s\n", object_path.c_str());
                std::fprintf(stderr, "%llx\n", to_ull(pc));
            }
            optional<cu_info> cu = lookup_cu(pc);
            if(cu) {
                const auto& cu_die = cu.unwrap().cu_die.get();
                // gnu non-standard debug-fission may create non-skeleton CU DIEs and just add dwo attributes
                // clang emits dwo names in the split CUs, so guard against going down the dwarf fission path (which
                // doesn't infinitely recurse because it's not emitted as an absolute path and there's no comp dir but
                // it's good to guard against the infinite recursion anyway)
                auto dwo_name = get_dwo_name(cu_die);
                if(cu_die.get_tag() == DW_TAG_skeleton_unit || (dwo_name && !skeleton)) {
                    perform_dwarf_fission_resolution(cu_die, dwo_name, object_frame_info, frame, inlines);
                } else {
                    retrieve_line_info(cu_die, pc, frame);
                    retrieve_symbol(cu_die, pc, cu.unwrap().dwversion, frame, inlines);
                }
            }
        }